

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void TPZSkylMatrix<long_double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<long_double> *storage,TPZVec<long_double_*> *point)

{
  long *plVar1;
  long lVar2;
  longdouble *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t dim;
  longdouble local_38;
  
  lVar2 = skyline->fNElements;
  if (lVar2 < 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      plVar1 = skyline->fStore + lVar4;
      lVar6 = lVar5 + lVar4;
      lVar4 = lVar4 + 1;
      lVar6 = (lVar6 + 1) - *plVar1;
    } while (lVar2 != lVar4);
    lVar4 = (lVar5 - *plVar1) + lVar4;
  }
  (*storage->_vptr_TPZVec[3])(storage,lVar4);
  local_38 = (longdouble)0;
  TPZVec<long_double>::Fill(storage,&local_38,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar2 + 1);
  if (lVar2 == 0) {
    *point->fStore = (longdouble *)0x0;
  }
  else {
    plVar3 = storage->fStore;
    *point->fStore = plVar3;
    point->fStore[lVar2] = plVar3 + lVar4;
    if (0 < lVar2) {
      lVar4 = 0x10;
      lVar6 = 0;
      do {
        point->fStore[lVar6 + 1] =
             (longdouble *)((long)point->fStore[lVar6] + lVar4 + skyline->fStore[lVar6] * -0x10);
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar2 != lVar6);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}